

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

int __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,char *__from,char *__to)

{
  double dVar1;
  double dVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  char *__to_00;
  long *plVar6;
  ulong uVar7;
  
  plVar6 = this->rootNode;
  __to_00 = (char *)0xffffffffffffffff;
  while (pcVar3 = (char *)*plVar6, pcVar3 != (char *)0xffffffffffffffff) {
    lVar4 = this[2].rootNode[1];
    dVar1 = *(double *)(lVar4 + 0x48 + (long)pcVar3 * 0x90);
    dVar2 = *(double *)(lVar4 + 0x48 + (long)__from * 0x90);
    uVar7 = 1;
    if ((dVar2 <= dVar1) && (uVar7 = 0, dVar1 <= dVar2)) {
      uVar7 = (ulong)((long)pcVar3 < (long)__from);
    }
    __to_00 = pcVar3;
    plVar6 = (long *)(lVar4 + (long)pcVar3 * 0x90 + uVar7 * 8 + 0x60);
  }
  iVar5 = CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
                    ((CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)this,__from,__to_00);
  return iVar5;
}

Assistant:

void link(LinkType z) {
    LinkType y = kNoLink;
    LinkType x = rootNode;
    while (x != kNoLink) {
      y = x;
      x = getChild(y, Dir(getKey(x) < getKey(z)));
    }

    static_cast<Impl*>(this)->link(z, y);
  }